

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O0

void ymt::SetAttribute(YMTAttributes attribute,string *value)

{
  string *value_local;
  YMTAttributes attribute_local;
  
  switch(attribute) {
  case CONFIG_FILENAME:
    std::__cxx11::string::operator=((string *)&config__abi_cxx11_,(string *)value);
    break;
  case LOG_INPUT_FILENAME:
    std::__cxx11::string::operator=((string *)&input_log__abi_cxx11_,(string *)value);
    break;
  case EXTRA_PARAM:
    std::__cxx11::string::operator=((string *)&extra_param__abi_cxx11_,(string *)value);
    break;
  case PORT:
    std::__cxx11::string::operator=((string *)&port__abi_cxx11_,(string *)value);
    break;
  case SERVER_ADDR:
    std::__cxx11::string::operator=((string *)&server_addr__abi_cxx11_,(string *)value);
    break;
  case PROFILE_NAME:
    std::__cxx11::string::operator=((string *)&profile_name__abi_cxx11_,(string *)value);
    break;
  case NEED_DUMP_BEFORE_LOAD:
    is_dump_needed_ = std::operator==(value,"true");
  }
  return;
}

Assistant:

void ymt::SetAttribute(YMTAttributes attribute, string value) {

	//Set Attributes
	switch (attribute) {
	case CONFIG_FILENAME:
		config_ = value;
		break;
	case LOG_INPUT_FILENAME:
		input_log_ = value;
		break;
	case EXTRA_PARAM:
		extra_param_ = value;
		break;
	case PORT:
		port_ = value;
		break;
	case SERVER_ADDR:
		server_addr_ = value;
		break;
	case PROFILE_NAME:
		profile_name_ = value;
		break;
	case NEED_DUMP_BEFORE_LOAD:
		is_dump_needed_ = (value == "true");
		break;
	}
}